

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O2

void __thiscall
visitor_test_should_skip_unknown_tags_Test::TestBody
          (visitor_test_should_skip_unknown_tags_Test *this)

{
  char *in_R9;
  undefined1 local_98 [8];
  VisitError<typename_Visitor::ResultType> err;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  
  doVisit<should_skip_unknown_tags::Visitor,should_skip_unknown_tags::VisitRules>
            (local_98,
             "8=FIX.4.4|9=0234|35=W|49=SNDR|59=ABC|34=1|52=20170609-09:27:24|55=AAA/BBB|262=123|268=2|269=0|270=1.181|271=50000|272=20170613|299=ABCDEFGH|9063=AB|269=1|270=1.1182|271=50000|272=20170613|299=ABCDEFH|9063=AB|9066=189718761|10=076|"
            );
  err.storage_.initialized_ = local_98[0];
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_98[0] == false) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&err.storage_.initialized_,
               (AssertionResult *)"err.isOk()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x375,(char *)gtest_ar_.message_.ptr_);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar_);
  Fixpp::result::Result<void,_Fixpp::ErrorKind>::~Result((Result<void,_Fixpp::ErrorKind> *)local_98)
  ;
  return;
}

Assistant:

TEST(visitor_test, should_skip_unknown_tags)
{
    const char* frame = "8=FIX.4.4|9=0234|35=W|49=SNDR|59=ABC|34=1|52=20170609-09:27:24|55=AAA/BBB|262=123|268=2|"
                        "269=0|270=1.181|271=50000|272=20170613|299=ABCDEFGH|9063=AB|"
                        "269=1|270=1.1182|271=50000|272=20170613|299=ABCDEFH|9063=AB|"
                        "9066=189718761|10=076|";

    auto err = doVisit(frame, should_skip_unknown_tags::Visitor(), should_skip_unknown_tags::VisitRules());
    ASSERT_TRUE(err.isOk());
}